

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::e_formatter::format(e_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  long lVar1;
  uint n;
  scoped_pad p;
  
  lVar1 = (msg->time).__d.__r;
  n = (int)(lVar1 / 1000000000) * -1000 + (int)(lVar1 / 1000000);
  if ((this->super_flag_formatter).padinfo_.width_ != 0) {
    scoped_pad::scoped_pad(&p,3,&(this->super_flag_formatter).padinfo_,dest);
    fmt_helper::pad3<unsigned_int,500ul>(n,dest);
    scoped_pad::~scoped_pad(&p);
    return;
  }
  fmt_helper::pad3<unsigned_int,500ul>(n,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        if (padinfo_.enabled())
        {
            const size_t field_size = 3;
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        }
        else
        {
            fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        }
    }